

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateMessageToPool
               (string *name_prefix,Descriptor *message,Printer *printer)

{
  FieldDescriptor *pFVar1;
  string *psVar2;
  bool bVar3;
  Descriptor *pDVar4;
  FieldDescriptor *this;
  FieldDescriptor *this_00;
  char *pcVar5;
  undefined1 in_CL;
  undefined1 uVar6;
  long lVar7;
  string *psVar8;
  int i_00;
  int i_01;
  int i_02;
  FieldDescriptor *field;
  Printer *this_01;
  long lVar9;
  int i_1;
  int i;
  long lVar10;
  long local_138;
  allocator<char> local_12a;
  allocator<char> local_129;
  Printer *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Descriptor *local_100;
  string local_f8;
  string local_d8;
  long local_b8;
  string local_b0;
  string class_name;
  string local_70;
  string local_50;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x6b) == '\0') {
    if (name_prefix->_M_string_length == 0) {
      std::__cxx11::string::string((string *)&class_name,*(string **)message);
    }
    else {
      std::operator+(&local_120,name_prefix,"_");
      std::operator+(&class_name,&local_120,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)message)
      ;
      std::__cxx11::string::~string((string *)&local_120);
    }
    MessageFullName_abi_cxx11_(&local_120,(php *)message,(Descriptor *)0x1,(bool)in_CL);
    io::Printer::Print(printer,
                       "$pool->addMessage(\'^message^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n"
                       ,"message",&local_120,"class_name",&class_name);
    std::__cxx11::string::~string((string *)&local_120);
    Indent(printer);
    local_138 = 0;
    lVar7 = 0;
    local_128 = printer;
    local_100 = message;
    while (lVar7 < *(int *)(local_100 + 0x2c)) {
      lVar10 = *(long *)(local_100 + 0x30);
      pFVar1 = (FieldDescriptor *)(local_138 + lVar10);
      local_b8 = lVar7;
      bVar3 = FieldDescriptor::is_map(pFVar1);
      uVar6 = (undefined1)lVar7;
      if (bVar3) {
        pDVar4 = FieldDescriptor::message_type(pFVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"key",(allocator<char> *)&local_f8);
        this = Descriptor::FindFieldByName(pDVar4,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        pDVar4 = FieldDescriptor::message_type(pFVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"value",(allocator<char> *)&local_f8);
        this_00 = Descriptor::FindFieldByName(pDVar4,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        psVar2 = *(string **)pFVar1;
        pcVar5 = FieldDescriptor::type_name(this);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar5,&local_129);
        ToUpper(&local_120,&local_f8);
        pcVar5 = FieldDescriptor::type_name(this_00);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar5,&local_12a);
        ToUpper(&local_d8,&local_b0);
        SimpleItoa_abi_cxx11_
                  (&local_70,(protobuf *)(ulong)*(uint *)(lVar10 + 0x38 + local_138),i_00);
        EnumOrMessageSuffix_abi_cxx11_(&local_50,(php *)this_00,(FieldDescriptor *)0x1,(bool)uVar6);
        psVar8 = &local_f8;
        io::Printer::Print(local_128,
                           "->map(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^key^, \\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n"
                           ,"field",psVar2,"key",&local_120,"value",&local_d8,"number",&local_70,
                           "other",&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_120);
LAB_00264479:
        std::__cxx11::string::~string((string *)psVar8);
      }
      else if (*(long *)(lVar10 + 0x60 + local_138) == 0) {
        psVar2 = *(string **)pFVar1;
        LabelForField_abi_cxx11_(&local_120,(php *)pFVar1,field);
        pcVar5 = FieldDescriptor::type_name(pFVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar5,(allocator<char> *)&local_50);
        ToUpper(&local_f8,&local_d8);
        SimpleItoa_abi_cxx11_
                  (&local_b0,(protobuf *)(ulong)*(uint *)(lVar10 + 0x38 + local_138),i_01);
        EnumOrMessageSuffix_abi_cxx11_(&local_70,(php *)pFVar1,(FieldDescriptor *)0x1,(bool)uVar6);
        psVar8 = &local_120;
        io::Printer::Print(local_128,
                           "->^label^(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
                           ,"field",psVar2,"label",psVar8,"type",&local_f8,"number",&local_b0,
                           "other",&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_d8);
        goto LAB_00264479;
      }
      local_138 = local_138 + 0xa8;
      lVar7 = local_b8 + 1;
    }
    this_01 = local_128;
    for (lVar7 = 0; lVar7 < *(int *)(local_100 + 0x38); lVar7 = lVar7 + 1) {
      lVar10 = *(long *)(local_100 + 0x40);
      psVar8 = *(string **)(lVar10 + lVar7 * 0x30);
      io::Printer::Print(this_01,"->oneof(^name^)\n","name",psVar8);
      Indent(this_01);
      lVar10 = lVar10 + lVar7 * 0x30;
      for (lVar9 = 0; this_01 = local_128, uVar6 = SUB81(psVar8,0), lVar9 < *(int *)(lVar10 + 0x1c);
          lVar9 = lVar9 + 1) {
        pFVar1 = *(FieldDescriptor **)(*(long *)(lVar10 + 0x20) + lVar9 * 8);
        psVar8 = *(string **)pFVar1;
        pcVar5 = FieldDescriptor::type_name(pFVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,pcVar5,(allocator<char> *)&local_70);
        ToUpper(&local_120,&local_f8);
        SimpleItoa_abi_cxx11_(&local_d8,(protobuf *)(ulong)*(uint *)(pFVar1 + 0x38),i_02);
        EnumOrMessageSuffix_abi_cxx11_(&local_b0,(php *)pFVar1,(FieldDescriptor *)0x1,(bool)uVar6);
        io::Printer::Print(local_128,
                           "->value(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
                           ,"field",psVar8,"type",&local_120,"number",&local_d8,"other",&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_f8);
      }
      io::Printer::Print(local_128,"->finish()\n");
      Outdent(this_01);
    }
    io::Printer::Print(this_01,"->finalizeToPool();\n");
    Outdent(this_01);
    io::Printer::Print(this_01,"\n");
    lVar7 = 0;
    for (lVar10 = 0; pDVar4 = local_100, lVar10 < *(int *)(local_100 + 0x48); lVar10 = lVar10 + 1) {
      GenerateMessageToPool(&class_name,(Descriptor *)(*(long *)(local_100 + 0x50) + lVar7),this_01)
      ;
      lVar7 = lVar7 + 0xa8;
    }
    lVar7 = 0;
    for (lVar10 = 0; lVar10 < *(int *)(pDVar4 + 0x58); lVar10 = lVar10 + 1) {
      GenerateEnumToPool((EnumDescriptor *)(*(long *)(pDVar4 + 0x60) + lVar7),this_01);
      lVar7 = lVar7 + 0x38;
    }
    std::__cxx11::string::~string((string *)&class_name);
  }
  return;
}

Assistant:

void GenerateMessageToPool(const string& name_prefix, const Descriptor* message,
                           io::Printer* printer) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }
  string class_name = name_prefix.empty()?
      message->name() : name_prefix + "_" + message->name();

  printer->Print(
      "$pool->addMessage('^message^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "message", MessageFullName(message, true),
      "class_name", class_name);

  Indent(printer);

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->is_map()) {
      const FieldDescriptor* key =
          field->message_type()->FindFieldByName("key");
      const FieldDescriptor* val =
          field->message_type()->FindFieldByName("value");
      printer->Print(
          "->map('^field^', \\Google\\Protobuf\\Internal\\GPBType::^key^, "
          "\\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n",
          "field", field->name(),
          "key", ToUpper(key->type_name()),
          "value", ToUpper(val->type_name()),
          "number", SimpleItoa(field->number()),
          "other", EnumOrMessageSuffix(val, true));
    } else if (!field->containing_oneof()) {
      printer->Print(
          "->^label^('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(),
          "label", LabelForField(field),
          "type", ToUpper(field->type_name()),
          "number", SimpleItoa(field->number()),
          "other", EnumOrMessageSuffix(field, true));
    }
  }

  // oneofs.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer->Print("->oneof(^name^)\n",
                   "name", oneof->name());
    Indent(printer);
    for (int index = 0; index < oneof->field_count(); index++) {
      const FieldDescriptor* field = oneof->field(index);
      printer->Print(
          "->value('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(),
          "type", ToUpper(field->type_name()),
          "number", SimpleItoa(field->number()),
          "other", EnumOrMessageSuffix(field, true));
    }
    printer->Print("->finish()\n");
    Outdent(printer);
  }

  printer->Print(
      "->finalizeToPool();\n");

  Outdent(printer);

  printer->Print(
      "\n");

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageToPool(class_name, message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumToPool(message->enum_type(i), printer);
  }
}